

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings_tests.cpp
# Opt level: O0

CMutableTransaction * blockencodings_tests::BuildTransactionTestCase(void)

{
  long lVar1;
  reference pvVar2;
  CMutableTransaction *in_RDI;
  long in_FS_OFFSET;
  CMutableTransaction *tx;
  CMutableTransaction *in_stack_ffffffffffffffb8;
  size_type in_stack_ffffffffffffffc0;
  CMutableTransaction *__new_size;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_stack_ffffffffffffffd8;
  size_type in_stack_ffffffffffffffe4;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  __new_size = in_RDI;
  CMutableTransaction::CMutableTransaction(in_stack_ffffffffffffffb8);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            (in_stack_ffffffffffffffd8,(size_type)__new_size);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[](&in_RDI->vin,in_stack_ffffffffffffffc0);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             CONCAT17(uVar3,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffffd8,
             (size_type)__new_size);
  pvVar2 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_RDI,in_stack_ffffffffffffffc0);
  pvVar2->nValue = 0x2a;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static CMutableTransaction BuildTransactionTestCase() {
    CMutableTransaction tx;
    tx.vin.resize(1);
    tx.vin[0].scriptSig.resize(10);
    tx.vout.resize(1);
    tx.vout[0].nValue = 42;
    return tx;
}